

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O2

size_t __thiscall player_t::FixPointers(player_t *this,DObject *old,DObject *rep)

{
  DPSprite *pDVar1;
  size_t sVar2;
  bool bVar3;
  
  bVar3 = this->mo == (APlayerPawn *)old;
  if (bVar3) {
    this->mo = (APlayerPawn *)rep;
  }
  sVar2 = (size_t)bVar3;
  if ((this->poisoner).field_0.p == (AActor *)old) {
    (this->poisoner).field_0.o = rep;
    sVar2 = sVar2 + 1;
  }
  if ((this->attacker).field_0.p == (AActor *)old) {
    (this->attacker).field_0.o = rep;
    sVar2 = sVar2 + 1;
  }
  if ((this->camera).field_0.p == (AActor *)old) {
    (this->camera).field_0.o = rep;
    sVar2 = sVar2 + 1;
  }
  if ((this->Bot).field_0.p == (DBot *)old) {
    (this->Bot).field_0.o = rep;
    sVar2 = sVar2 + 1;
  }
  if (this->ReadyWeapon == (AWeapon *)old) {
    this->ReadyWeapon = (AWeapon *)rep;
    sVar2 = sVar2 + 1;
  }
  if (this->PendingWeapon == (AWeapon *)old) {
    this->PendingWeapon = (AWeapon *)rep;
    sVar2 = sVar2 + 1;
  }
  if ((this->PremorphWeapon).field_0.p == (AWeapon *)old) {
    (this->PremorphWeapon).field_0.o = rep;
    sVar2 = sVar2 + 1;
  }
  pDVar1 = GC::ReadBarrier<DPSprite>((DPSprite **)&this->psprites);
  if (pDVar1 == (DPSprite *)old) {
    (this->psprites).field_0.o = rep;
    sVar2 = sVar2 + 1;
  }
  if ((this->ConversationNPC).field_0.p == (AActor *)old) {
    (this->ConversationNPC).field_0.o = rep;
    sVar2 = sVar2 + 1;
  }
  if ((this->ConversationPC).field_0.p == (AActor *)old) {
    (this->ConversationPC).field_0.o = rep;
    sVar2 = sVar2 + 1;
  }
  if ((this->MUSINFOactor).field_0.p == (AActor *)old) {
    (this->MUSINFOactor).field_0.o = rep;
    sVar2 = sVar2 + 1;
  }
  return sVar2;
}

Assistant:

size_t player_t::FixPointers (const DObject *old, DObject *rep)
{
	APlayerPawn *replacement = static_cast<APlayerPawn *>(rep);
	size_t changed = 0;

	// The construct *& is used in several of these to avoid the read barriers
	// that would turn the pointer we want to check to NULL if the old object
	// is pending deletion.
	if (mo == old)					mo = replacement, changed++;
	if (*&poisoner == old)			poisoner = replacement, changed++;
	if (*&attacker == old)			attacker = replacement, changed++;
	if (*&camera == old)			camera = replacement, changed++;
	if (*&Bot == old)				Bot = static_cast<DBot *>(rep), changed++;
	if (ReadyWeapon == old)			ReadyWeapon = static_cast<AWeapon *>(rep), changed++;
	if (PendingWeapon == old)		PendingWeapon = static_cast<AWeapon *>(rep), changed++;
	if (*&PremorphWeapon == old)	PremorphWeapon = static_cast<AWeapon *>(rep), changed++;
	if (psprites == old)			psprites = static_cast<DPSprite *>(rep), changed++;
	if (*&ConversationNPC == old)	ConversationNPC = replacement, changed++;
	if (*&ConversationPC == old)	ConversationPC = replacement, changed++;
	if (*&MUSINFOactor == old)		MUSINFOactor = replacement, changed++;
	return changed;
}